

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O2

uint32_t FAPOBase_IsInputFormatSupported
                   (FAPOBase *fapo,FAudioWaveFormatEx *pOutputFormat,
                   FAudioWaveFormatEx *pRequestedInputFormat,
                   FAudioWaveFormatEx **ppSupportedInputFormat)

{
  FAudioWaveFormatEx *pFVar1;
  uint32_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint16_t uVar5;
  
  if (((((pRequestedInputFormat->wFormatTag != 3) ||
        ((ushort)(pRequestedInputFormat->nChannels - 0x41) < 0xffc0)) ||
       (pRequestedInputFormat->nSamplesPerSec - 0x30d41 < 0xfffcf6a7)) ||
      (uVar2 = 0, pRequestedInputFormat->wBitsPerSample != 0x20)) &&
     (uVar2 = 0x88970001, ppSupportedInputFormat != (FAudioWaveFormatEx **)0x0)) {
    pFVar1 = *ppSupportedInputFormat;
    pFVar1->wFormatTag = 3;
    uVar3 = pRequestedInputFormat->nChannels + (ushort)(pRequestedInputFormat->nChannels == 0);
    uVar5 = 0x40;
    if (uVar3 < 0x40) {
      uVar5 = uVar3;
    }
    pFVar1->nChannels = uVar5;
    uVar4 = 1000;
    if (1000 < pRequestedInputFormat->nSamplesPerSec) {
      uVar4 = pRequestedInputFormat->nSamplesPerSec;
    }
    if (199999 < uVar4) {
      uVar4 = 200000;
    }
    pFVar1->nSamplesPerSec = uVar4;
    pFVar1->wBitsPerSample = 0x20;
  }
  return uVar2;
}

Assistant:

uint32_t FAPOBase_IsInputFormatSupported(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pOutputFormat,
	const FAudioWaveFormatEx *pRequestedInputFormat,
	FAudioWaveFormatEx **ppSupportedInputFormat
) {
	if (	pRequestedInputFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pRequestedInputFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pRequestedInputFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pRequestedInputFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pRequestedInputFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pRequestedInputFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (ppSupportedInputFormat != NULL)
		{
			(*ppSupportedInputFormat)->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			(*ppSupportedInputFormat)->nChannels = FAudio_clamp(
				pRequestedInputFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			(*ppSupportedInputFormat)->nSamplesPerSec = FAudio_clamp(
				pRequestedInputFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			(*ppSupportedInputFormat)->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}